

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

JsonObjectWriter * __thiscall
Catch::JsonArrayWriter::writeObject(JsonObjectWriter *__return_storage_ptr__,JsonArrayWriter *this)

{
  ostream *poVar1;
  uint64_t uVar2;
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  JsonUtils::appendCommaNewline(this->m_os,&this->m_should_comma,this->m_indent_level + 1);
  poVar1 = this->m_os;
  uVar2 = this->m_indent_level;
  __return_storage_ptr__->m_os = poVar1;
  __return_storage_ptr__->m_indent_level = uVar2 + 1;
  __return_storage_ptr__->m_should_comma = false;
  __return_storage_ptr__->m_active = true;
  uStack_18 = CONCAT17(0x7b,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return __return_storage_ptr__;
}

Assistant:

JsonObjectWriter JsonArrayWriter::writeObject() {
        JsonUtils::appendCommaNewline(
            m_os, m_should_comma, m_indent_level + 1 );
        return JsonObjectWriter{ m_os, m_indent_level + 1 };
    }